

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_tri_ideal(REF_GRID ref_grid,REF_INT node,REF_INT tri,REF_DBL *ideal_location)

{
  REF_NODE ref_node_00;
  double dVar1;
  double dVar2;
  double local_250;
  double local_240;
  double local_238;
  double local_228;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL length_in_metric;
  REF_DBL scale;
  REF_DBL projection;
  REF_DBL tangent_length;
  REF_DBL m [6];
  REF_DBL log_m [6];
  REF_DBL log_m2 [6];
  REF_DBL log_m1 [6];
  REF_DBL log_m0 [6];
  REF_DBL dt [3];
  double local_d8;
  REF_DBL dn [3];
  int local_b8;
  int local_b4;
  REF_INT i;
  REF_INT ixyz;
  REF_INT n1;
  REF_INT n0;
  REF_INT nodes [27];
  REF_NODE ref_node;
  REF_DBL *ideal_location_local;
  REF_INT tri_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_grid_local._4_4_ = ref_cell_nodes(ref_grid->cell[3],tri,&n1);
  if (ref_grid_local._4_4_ == 0) {
    ixyz = -1;
    i = -1;
    if (node == n1) {
      ixyz = n0;
      i = nodes[0];
    }
    if (node == n0) {
      ixyz = nodes[0];
      i = n1;
    }
    if (node == nodes[0]) {
      ixyz = n1;
      i = n0;
    }
    if ((ixyz == -1) || (i == -1)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x12d,"ref_smooth_tri_ideal","empty triangle side");
      ref_grid_local._4_4_ = 1;
    }
    else {
      for (local_b4 = 0; local_b4 < 3; local_b4 = local_b4 + 1) {
        ideal_location[local_b4] =
             (ref_node_00->real[local_b4 + ixyz * 0xf] + ref_node_00->real[local_b4 + i * 0xf]) *
             0.5;
      }
      for (local_b4 = 0; local_b4 < 3; local_b4 = local_b4 + 1) {
        dn[(long)local_b4 + -1] =
             ref_node_00->real[local_b4 + node * 0xf] - ideal_location[local_b4];
      }
      for (local_b4 = 0; local_b4 < 3; local_b4 = local_b4 + 1) {
        log_m0[(long)local_b4 + 5] =
             ref_node_00->real[local_b4 + i * 0xf] - ref_node_00->real[local_b4 + ixyz * 0xf];
      }
      dVar1 = dt[1] * dt[1] + log_m0[5] * log_m0[5] + dt[0] * dt[0];
      dVar2 = dn[1] * dt[1] + local_d8 * log_m0[5] + dn[0] * dt[0];
      if (dVar1 * 1e+20 <= 0.0) {
        local_228 = -(dVar1 * 1e+20);
      }
      else {
        local_228 = dVar1 * 1e+20;
      }
      local_238 = dVar2;
      if (dVar2 <= 0.0) {
        local_238 = -dVar2;
      }
      if (local_228 <= local_238) {
        printf("projection = %e tangent_length = %e\n",dVar2,dVar1);
        ref_grid_local._4_4_ = 4;
      }
      else {
        for (local_b4 = 0; local_b4 < 3; local_b4 = local_b4 + 1) {
          dn[(long)local_b4 + -1] =
               -(dVar2 / dVar1) * log_m0[(long)local_b4 + 5] + dn[(long)local_b4 + -1];
        }
        ref_grid_local._4_4_ = ref_math_normalize(&local_d8);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = ref_node_metric_get_log(ref_node_00,ixyz,log_m1 + 5);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = ref_node_metric_get_log(ref_node_00,i,log_m2 + 5);
            if (ref_grid_local._4_4_ == 0) {
              ref_grid_local._4_4_ = ref_node_metric_get_log(ref_node_00,node,log_m + 5);
              if (ref_grid_local._4_4_ == 0) {
                for (local_b8 = 0; local_b8 < 6; local_b8 = local_b8 + 1) {
                  m[(long)local_b8 + 5] =
                       (log_m1[(long)local_b8 + 5] + log_m2[(long)local_b8 + 5] +
                       log_m[(long)local_b8 + 5]) / 3.0;
                }
                ref_grid_local._4_4_ = ref_matrix_exp_m(m + 5,&tangent_length);
                if (ref_grid_local._4_4_ == 0) {
                  dVar1 = sqrt(dn[1] * (m[4] * dn[1] + m[1] * local_d8 + m[3] * dn[0]) +
                               local_d8 * (m[1] * dn[1] + tangent_length * local_d8 + m[0] * dn[0])
                               + dn[0] * (m[3] * dn[1] + m[0] * local_d8 + m[2] * dn[0]));
                  dVar2 = sqrt(3.0);
                  dVar2 = dVar2 * 0.5;
                  if (dVar1 * 1e+20 <= 0.0) {
                    local_240 = -(dVar1 * 1e+20);
                  }
                  else {
                    local_240 = dVar1 * 1e+20;
                  }
                  local_250 = dVar2;
                  if (dVar2 <= 0.0) {
                    local_250 = -dVar2;
                  }
                  if (local_240 <= local_250) {
                    printf(" length_in_metric = %e, not invertible\n",dVar1);
                    ref_grid_local._4_4_ = 4;
                  }
                  else {
                    for (local_b4 = 0; local_b4 < 3; local_b4 = local_b4 + 1) {
                      ideal_location[local_b4] =
                           (dVar2 / dVar1) * dn[(long)local_b4 + -1] + ideal_location[local_b4];
                    }
                    ref_grid_local._4_4_ = 0;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x14a,"ref_smooth_tri_ideal",(ulong)ref_grid_local._4_4_,"exp avg");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x148,"ref_smooth_tri_ideal",(ulong)ref_grid_local._4_4_,"get node log m");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x147,"ref_smooth_tri_ideal",(ulong)ref_grid_local._4_4_,"get n1 log m");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x146,"ref_smooth_tri_ideal",(ulong)ref_grid_local._4_4_,"get n0 log m");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x143,"ref_smooth_tri_ideal",(ulong)ref_grid_local._4_4_,"normalize direction");
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x11e,
           "ref_smooth_tri_ideal",(ulong)ref_grid_local._4_4_,"get tri");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tri_ideal(REF_GRID ref_grid, REF_INT node,
                                        REF_INT tri, REF_DBL *ideal_location) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT n0, n1;
  REF_INT ixyz, i;
  REF_DBL dn[3];
  REF_DBL dt[3];
  REF_DBL log_m0[6], log_m1[6], log_m2[6], log_m[6];
  REF_DBL m[6];
  REF_DBL tangent_length, projection, scale, length_in_metric;

  RSS(ref_cell_nodes(ref_grid_tri(ref_grid), tri, nodes), "get tri");
  n0 = REF_EMPTY;
  n1 = REF_EMPTY;
  if (node == nodes[0]) {
    n0 = nodes[1];
    n1 = nodes[2];
  }
  if (node == nodes[1]) {
    n0 = nodes[2];
    n1 = nodes[0];
  }
  if (node == nodes[2]) {
    n0 = nodes[0];
    n1 = nodes[1];
  }
  if (n0 == REF_EMPTY || n1 == REF_EMPTY) THROW("empty triangle side");

  for (ixyz = 0; ixyz < 3; ixyz++)
    ideal_location[ixyz] = 0.5 * (ref_node_xyz(ref_node, ixyz, n0) +
                                  ref_node_xyz(ref_node, ixyz, n1));
  for (ixyz = 0; ixyz < 3; ixyz++)
    dn[ixyz] = ref_node_xyz(ref_node, ixyz, node) - ideal_location[ixyz];
  for (ixyz = 0; ixyz < 3; ixyz++)
    dt[ixyz] =
        ref_node_xyz(ref_node, ixyz, n1) - ref_node_xyz(ref_node, ixyz, n0);

  tangent_length = ref_math_dot(dt, dt);
  projection = ref_math_dot(dn, dt);

  if (ref_math_divisible(projection, tangent_length)) {
    for (ixyz = 0; ixyz < 3; ixyz++)
      dn[ixyz] -= (projection / tangent_length) * dt[ixyz];
  } else {
    printf("projection = %e tangent_length = %e\n", projection, tangent_length);
    return REF_DIV_ZERO;
  }

  RSS(ref_math_normalize(dn), "normalize direction");

  /* averaged metric */
  RSS(ref_node_metric_get_log(ref_node, n0, log_m0), "get n0 log m");
  RSS(ref_node_metric_get_log(ref_node, n1, log_m1), "get n1 log m");
  RSS(ref_node_metric_get_log(ref_node, node, log_m2), "get node log m");
  for (i = 0; i < 6; i++) log_m[i] = (log_m0[i] + log_m1[i] + log_m2[i]) / 3.0;
  RSS(ref_matrix_exp_m(log_m, m), "exp avg");

  length_in_metric = ref_matrix_sqrt_vt_m_v(m, dn);

  scale = 0.5 * sqrt(3.0); /* altitude of equilateral triangle */
  if (ref_math_divisible(scale, length_in_metric)) {
    scale = scale / length_in_metric;
  } else {
    printf(" length_in_metric = %e, not invertible\n", length_in_metric);
    return REF_DIV_ZERO;
  }

  for (ixyz = 0; ixyz < 3; ixyz++) ideal_location[ixyz] += scale * dn[ixyz];

  return REF_SUCCESS;
}